

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O1

double __thiscall
iaf_psc_alpha::propagator_31(iaf_psc_alpha *this,double tau_syn,double tau,double C,double h)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = -h / tau;
  dVar5 = exp(dVar1);
  dVar6 = -h / tau_syn;
  dVar2 = exp(dVar6);
  dVar3 = expm1(h / tau_syn + dVar1);
  dVar6 = exp(dVar6);
  dVar1 = exp(dVar1);
  dVar1 = dVar1 * ((h * h * 0.5) / C);
  if ((tau != tau_syn) || (NAN(tau) || NAN(tau_syn))) {
    dVar4 = tau / tau_syn + -1.0;
    dVar6 = (((((dVar2 * dVar3) / dVar4) * tau - dVar6 * h) * (1.0 / C)) / dVar4) * tau;
    if ((0.1 <= ABS(tau - tau_syn)) ||
       (dVar5 = ABS((tau_syn - tau) * (1.0 / (C * 3.0 * tau * tau)) * h * h * h * dVar5),
       ABS(dVar6 - dVar1) <= dVar5 + dVar5)) {
      dVar1 = dVar6;
    }
  }
  return dVar1;
}

Assistant:

double iaf_psc_alpha::propagator_31( double tau_syn, double tau, double C, double h )
{
  const double P31_linear = 1 / ( 3. * C * tau * tau ) * h * h * h * ( tau_syn - tau ) * std::exp( -h / tau );
  const double P31 =
    1 / C * ( std::exp( -h / tau_syn ) * std::expm1( -h / tau + h / tau_syn ) / ( tau / tau_syn - 1 ) * tau
              - h * std::exp( -h / tau_syn ) ) / ( -1 - -tau / tau_syn ) * tau;
  const double P31_singular = h * h / 2 / C * std::exp( -h / tau );
  const double de31 = std::abs( P31 - P31_singular );

  if ( tau == tau_syn or ( std::abs( tau - tau_syn ) < 0.1 and de31 > 2 * std::abs( P31_linear ) ) )
  {
    return P31_singular;
  }
  else
  {
    return P31;
  }
}